

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void uv_sem_destroy(uv_sem_t *sem)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  if (platform_needs_custom_semaphore == 0) {
    iVar1 = sem_destroy((sem_t *)sem);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    __mutex = (pthread_mutex_t *)sem->__align;
    iVar1 = pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_destroy(__mutex);
      if (iVar1 == 0) {
        uv__free(__mutex);
        return;
      }
    }
  }
  abort();
}

Assistant:

void uv_sem_destroy(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_destroy(sem);
  else
    uv__sem_destroy(sem);
}